

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_expandJobsTable(ZSTDMT_CCtx *mtctx,U32 nbWorkers)

{
  ZSTDMT_jobDescription *pZVar1;
  uint local_20;
  U32 local_1c;
  U32 nbJobs;
  U32 nbWorkers_local;
  ZSTDMT_CCtx *mtctx_local;
  
  local_20 = nbWorkers + 2;
  if (mtctx->jobIDMask + 1 < local_20) {
    local_1c = nbWorkers;
    _nbJobs = mtctx;
    ZSTDMT_freeJobsTable(mtctx->jobs,mtctx->jobIDMask + 1,mtctx->cMem);
    _nbJobs->jobIDMask = 0;
    pZVar1 = ZSTDMT_createJobsTable(&local_20,_nbJobs->cMem);
    _nbJobs->jobs = pZVar1;
    if (_nbJobs->jobs == (ZSTDMT_jobDescription *)0x0) {
      return 0xffffffffffffffc0;
    }
    if (local_20 == 0 || (local_20 & local_20 - 1) != 0) {
      __assert_fail("(nbJobs != 0) && ((nbJobs & (nbJobs - 1)) == 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4dc0,"size_t ZSTDMT_expandJobsTable(ZSTDMT_CCtx *, U32)");
    }
    _nbJobs->jobIDMask = local_20 - 1;
  }
  return 0;
}

Assistant:

static size_t ZSTDMT_expandJobsTable (ZSTDMT_CCtx* mtctx, U32 nbWorkers) {
    U32 nbJobs = nbWorkers + 2;
    if (nbJobs > mtctx->jobIDMask+1) {  /* need more job capacity */
        ZSTDMT_freeJobsTable(mtctx->jobs, mtctx->jobIDMask+1, mtctx->cMem);
        mtctx->jobIDMask = 0;
        mtctx->jobs = ZSTDMT_createJobsTable(&nbJobs, mtctx->cMem);
        if (mtctx->jobs==NULL) return ERROR(memory_allocation);
        assert((nbJobs != 0) && ((nbJobs & (nbJobs - 1)) == 0));  /* ensure nbJobs is a power of 2 */
        mtctx->jobIDMask = nbJobs - 1;
    }
    return 0;
}